

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O0

void __thiscall
sf2cute::SFInstrumentZone::SFInstrumentZone(SFInstrumentZone *this,SFInstrumentZone *origin)

{
  SFInstrumentZone *origin_local;
  SFInstrumentZone *this_local;
  
  SFZone::SFZone(&this->super_SFZone,&origin->super_SFZone);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFInstrumentZone_00163750;
  std::weak_ptr<sf2cute::SFSample>::weak_ptr(&this->sample_,&origin->sample_);
  this->parent_instrument_ = (SFInstrument *)0x0;
  return;
}

Assistant:

SFInstrumentZone::SFInstrumentZone(const SFInstrumentZone & origin) :
    SFZone(origin),
    sample_(origin.sample_),
    parent_instrument_(nullptr) {
}